

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringReplaceHelper.cxx
# Opt level: O2

bool __thiscall
cmStringReplaceHelper::Replace(cmStringReplaceHelper *this,string *input,string *output)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  pointer pRVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pRVar11;
  char *pcVar12;
  ostringstream error;
  string local_1c8 [32];
  string local_1a8 [376];
  
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  pcVar12 = (char *)0x0;
  do {
    bVar5 = cmsys::RegularExpression::find
                      (&this->RegularExpression,pcVar12 + (long)(input->_M_dataplus)._M_p);
    if (!bVar5) {
      std::__cxx11::string::substr((ulong)local_1a8,(ulong)input);
      std::__cxx11::string::append((string *)output);
      std::__cxx11::string::~string(local_1a8);
LAB_00391892:
      return !bVar5;
    }
    if (this->Makefile != (cmMakefile *)0x0) {
      cmMakefile::ClearMatches(this->Makefile);
      cmMakefile::StoreMatches(this->Makefile,&this->RegularExpression);
    }
    pcVar1 = (this->RegularExpression).regmatch.startp[0];
    pcVar2 = (this->RegularExpression).regmatch.endp[0];
    pcVar3 = (this->RegularExpression).regmatch.searchstring;
    std::__cxx11::string::substr((ulong)local_1a8,(ulong)input);
    std::__cxx11::string::append((string *)output);
    std::__cxx11::string::~string(local_1a8);
    if (pcVar2 == pcVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar8 = std::operator<<((ostream *)local_1a8,"regex \"");
      poVar8 = std::operator<<(poVar8,(string *)&this->RegExString);
      std::operator<<(poVar8,"\" matched an empty string");
      std::__cxx11::stringbuf::str();
LAB_0039186b:
      std::__cxx11::string::operator=((string *)this,local_1c8);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      goto LAB_00391892;
    }
    pRVar4 = (this->Replacements).
             super__Vector_base<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar11 = (this->Replacements).
                   super__Vector_base<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
                   ._M_impl.super__Vector_impl_data._M_start; pRVar11 != pRVar4;
        pRVar11 = pRVar11 + 1) {
      lVar6 = (long)pRVar11->Number;
      if (lVar6 < 0) {
        std::__cxx11::string::append((string *)output);
      }
      else {
        pcVar1 = (this->RegularExpression).regmatch.searchstring;
        uVar10 = (long)(this->RegularExpression).regmatch.startp[lVar6] - (long)pcVar1;
        if ((((uVar10 == 0xffffffffffffffff) ||
             (uVar9 = (long)(this->RegularExpression).regmatch.endp[lVar6] - (long)pcVar1,
             uVar9 == 0xffffffffffffffff)) ||
            (uVar7 = input->_M_string_length - (long)pcVar12, uVar7 < uVar10)) || (uVar7 < uVar9)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          poVar8 = std::operator<<((ostream *)local_1a8,"replace expression \"");
          poVar8 = std::operator<<(poVar8,(string *)&this->ReplaceExpression);
          poVar8 = std::operator<<(poVar8,"\" contains an out-of-range escape for regex \"");
          poVar8 = std::operator<<(poVar8,(string *)&this->RegExString);
          std::operator<<(poVar8,"\"");
          std::__cxx11::stringbuf::str();
          goto LAB_0039186b;
        }
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)input);
        std::__cxx11::string::append((string *)output);
        std::__cxx11::string::~string(local_1a8);
      }
    }
    pcVar12 = pcVar2 + ((long)pcVar12 - (long)pcVar3);
  } while( true );
}

Assistant:

bool cmStringReplaceHelper::Replace(const std::string& input,
                                    std::string& output)
{
  output.clear();

  // Scan through the input for all matches.
  std::string::size_type base = 0;
  while (this->RegularExpression.find(input.c_str() + base)) {
    if (this->Makefile != nullptr) {
      this->Makefile->ClearMatches();
      this->Makefile->StoreMatches(this->RegularExpression);
    }
    auto l2 = this->RegularExpression.start();
    auto r = this->RegularExpression.end();

    // Concatenate the part of the input that was not matched.
    output += input.substr(base, l2);

    // Make sure the match had some text.
    if (r - l2 == 0) {
      std::ostringstream error;
      error << "regex \"" << this->RegExString << "\" matched an empty string";
      this->ErrorString = error.str();
      return false;
    }

    // Concatenate the replacement for the match.
    for (const auto& replacement : this->Replacements) {
      if (replacement.Number < 0) {
        // This is just a plain-text part of the replacement.
        output += replacement.Value;
      } else {
        // Replace with part of the match.
        auto n = replacement.Number;
        auto start = this->RegularExpression.start(n);
        auto end = this->RegularExpression.end(n);
        auto len = input.length() - base;
        if ((start != std::string::npos) && (end != std::string::npos) &&
            (start <= len) && (end <= len)) {
          output += input.substr(base + start, end - start);
        } else {
          std::ostringstream error;
          error << "replace expression \"" << this->ReplaceExpression
                << "\" contains an out-of-range escape for regex \""
                << this->RegExString << "\"";
          this->ErrorString = error.str();
          return false;
        }
      }
    }

    // Move past the match.
    base += r;
  }

  // Concatenate the text after the last match.
  output += input.substr(base, input.length() - base);

  return true;
}